

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void __thiscall context::generate_labels(context *this)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long lVar4;
  byte bVar5;
  byte *__s;
  __hashtable *__h;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int64_t local_38;
  
  if (this->column != 0 || this->line != 0) {
    __assert_fail("line == 0 && column == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/context.cpp"
                  ,0x115,"void context::generate_labels()");
  }
  this->pc = 8;
  __s = (byte *)this->text;
  bVar5 = *__s;
  if (bVar5 == 0) {
LAB_0012d6e0:
    this->text = this->text_begin;
    this->line = 0;
    this->column = 0;
    this->pc = 0;
    return;
  }
  paVar2 = &local_78.field_2;
LAB_0012d559:
  if ((int)(char)(bVar5 & 0xdf) - 0x41U < 0x1a) {
    do {
      cVar3 = *this->text;
      if (((int)cVar3 - 0x30U < 10) || (((int)cVar3 & 0xffffffdfU) - 0x41 < 0x1a)) {
        if (cVar3 == ';') {
          lVar4 = this->pc;
          uVar1 = lVar4 + 8;
          this->pc = uVar1;
          if ((uVar1 & 0x1f) == 0) {
            this->pc = lVar4 + 0x10;
          }
        }
      }
      else if (cVar3 != '_') goto LAB_0012d5ee;
      next(this);
    } while( true );
  }
  do {
    if (*this->text == ';') {
      lVar4 = this->pc;
      uVar1 = lVar4 + 8;
      this->pc = uVar1;
      if ((uVar1 & 0x1f) == 0) {
        this->pc = lVar4 + 0x10;
      }
    }
    next(this);
  } while ((*this->text != '\0') && (0 < this->column));
  goto LAB_0012d6d0;
LAB_0012d5ee:
  if (cVar3 == ':') {
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity._0_4_ =
         local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_78,(char *)__s,(long)this->text - (long)__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar2) {
      local_48._8_4_ = local_78.field_2._8_4_;
      local_48._12_4_ = local_78.field_2._12_4_;
      local_58 = &local_48;
    }
    else {
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_78._M_dataplus._M_p;
    }
    local_48._M_allocated_capacity._4_4_ = local_78.field_2._M_allocated_capacity._4_4_;
    local_48._M_allocated_capacity._0_4_ = local_78.field_2._M_allocated_capacity._0_4_;
    local_50 = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity._0_4_ =
         local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_38 = this->pc;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,long>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->labels,&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                               local_78.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  do {
    if (*this->text == ';') {
      lVar4 = this->pc;
      uVar1 = lVar4 + 8;
      this->pc = uVar1;
      if ((uVar1 & 0x1f) == 0) {
        this->pc = lVar4 + 0x10;
      }
    }
    next(this);
  } while ((*this->text != '\0') && (0 < this->column));
LAB_0012d6d0:
  __s = (byte *)this->text;
  bVar5 = *__s;
  if (bVar5 == 0) goto LAB_0012d6e0;
  goto LAB_0012d559;
}

Assistant:

void context::generate_labels()
{
    const auto advance = [this] {
        if (*text == ';') {
            pc += 8;
            if (pc % 0x20 == 0) {
                pc += 8;
            }
        }
        next();
    };
    const auto next_line = [this, advance] {
        do {
            advance();
        } while (*text && column > 0);
    };

    assert(line == 0 && column == 0);

    pc = 8;

    while (*text) {
        if (!is_alpha(*text)) {
            next_line();
            continue;
        }
        const char* const potential_label = text;
        while (is_alnum(*text) || *text == '_') {
            advance();
        }
        if (*text == ':') {
            std::string label;
            label.append(potential_label, static_cast<size_t>(text - potential_label));
            labels.insert({std::move(label), pc});
        }
        next_line();
    }

    reset();
}